

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSolve.c
# Opt level: O3

void Cec_ManSatSolveCSat(Cec_ManPat_t *pPat,Gia_Man_t *pAig,Cec_ParSat_t *pPars)

{
  Gia_Obj_t *pGVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *vPat;
  int *piVar5;
  Vec_Int_t *vCexStore;
  Vec_Int_t *pVVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  Vec_Str_t *vStatus;
  timespec ts;
  Vec_Str_t *local_50;
  timespec local_48;
  Cec_ParSat_t *local_38;
  
  vPat = (Vec_Int_t *)malloc(0x10);
  vPat->nCap = 1000;
  vPat->nSize = 0;
  piVar5 = (int *)malloc(4000);
  vPat->pArray = piVar5;
  local_38 = pPars;
  vCexStore = Cbs_ManSolveMiterNc(pAig,pPars->nBTLimit,&local_50,0);
  iVar3 = local_50->nSize;
  pVVar6 = pAig->vCos;
  if (iVar3 != pVVar6->nSize) {
    __assert_fail("Vec_StrSize(vStatus) == Gia_ManCoNum(pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSolve.c"
                  ,0x304,"void Cec_ManSatSolveCSat(Cec_ManPat_t *, Gia_Man_t *, Cec_ParSat_t *)");
  }
  if (pPat != (Cec_ManPat_t *)0x0) {
    pPat->iStart = pPat->vStorage->nSize;
    pPat->nPats = 0;
    pPat->nPatLits = 0;
    pPat->nPatLitsMin = 0;
  }
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  else {
    lVar9 = 0;
    iVar3 = 0;
    do {
      iVar4 = pVVar6->pArray[lVar9];
      if (((long)iVar4 < 0) || (pAig->nObjs <= iVar4)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
      if (local_50->nSize <= lVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      pGVar1 = pAig->pObjs + iVar4;
      cVar2 = local_50->pArray[lVar9];
      *(ulong *)pGVar1 =
           (ulong)(cVar2 == '\x01') << 0x3e |
           *(ulong *)pGVar1 & 0xbfffffffbfffffff | (ulong)((uint)(cVar2 == '\0') << 0x1e);
      if ((0 < vCexStore->nSize) && (cVar2 != '\x01')) {
        iVar3 = Cec_ManSatSolveExractPattern(vCexStore,iVar3,vPat);
      }
      if (cVar2 == '\0') {
        if ((pPat != (Cec_ManPat_t *)0x0) && (0 < vPat->nSize)) {
          iVar4 = clock_gettime(3,&local_48);
          if (iVar4 < 0) {
            lVar7 = 1;
          }
          else {
            lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
            lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_48.tv_sec * -1000000;
          }
          Cec_ManPatSavePatternCSat(pPat,vPat);
          iVar4 = clock_gettime(3,&local_48);
          if (iVar4 < 0) {
            lVar8 = -1;
          }
          else {
            lVar8 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
          }
          pPat->timeTotalSave = pPat->timeTotalSave + lVar8 + lVar7;
        }
        if (local_38->fCheckMiter != 0) break;
      }
      lVar9 = lVar9 + 1;
      pVVar6 = pAig->vCos;
    } while (lVar9 < pVVar6->nSize);
  }
  if (iVar3 != vCexStore->nSize) {
    __assert_fail("iStart == Vec_IntSize(vCexStore)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecSolve.c"
                  ,0x321,"void Cec_ManSatSolveCSat(Cec_ManPat_t *, Gia_Man_t *, Cec_ParSat_t *)");
  }
  if (vPat->pArray != (int *)0x0) {
    free(vPat->pArray);
  }
  free(vPat);
  if (local_50->pArray != (char *)0x0) {
    free(local_50->pArray);
  }
  free(local_50);
  if (vCexStore->pArray != (int *)0x0) {
    free(vCexStore->pArray);
  }
  free(vCexStore);
  return;
}

Assistant:

void Cec_ManSatSolveCSat( Cec_ManPat_t * pPat, Gia_Man_t * pAig, Cec_ParSat_t * pPars )
{
    Vec_Str_t * vStatus;
    Vec_Int_t * vPat = Vec_IntAlloc( 1000 );
    Vec_Int_t * vCexStore = Cbs_ManSolveMiterNc( pAig, pPars->nBTLimit, &vStatus, 0 );
    Gia_Obj_t * pObj;
    int i, status, iStart = 0;
    assert( Vec_StrSize(vStatus) == Gia_ManCoNum(pAig) );
    // reset the manager
    if ( pPat )
    {
        pPat->iStart = Vec_StrSize(pPat->vStorage);
        pPat->nPats = 0;
        pPat->nPatLits = 0;
        pPat->nPatLitsMin = 0;
    } 
    Gia_ManForEachCo( pAig, pObj, i )
    {
        status = (int)Vec_StrEntry(vStatus, i);
        pObj->fMark0 = (status == 0);
        pObj->fMark1 = (status == 1);
        if ( Vec_IntSize(vCexStore) > 0 && status != 1 )
            iStart = Cec_ManSatSolveExractPattern( vCexStore, iStart, vPat );
        if ( status != 0 )
            continue;
        // save the pattern
        if ( pPat && Vec_IntSize(vPat) > 0 )
        {
            abctime clk3 = Abc_Clock();
            Cec_ManPatSavePatternCSat( pPat, vPat );
            pPat->timeTotalSave += Abc_Clock() - clk3;
        }
        // quit if one of them is solved
        if ( pPars->fCheckMiter )
            break;
    }
    assert( iStart == Vec_IntSize(vCexStore) );
    Vec_IntFree( vPat );
    Vec_StrFree( vStatus );
    Vec_IntFree( vCexStore );
}